

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O2

t_symbol * sys_decodedialog(t_symbol *s)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  t_symbol *ptVar4;
  char *pcVar5;
  char buf [1000];
  char local_3f8 [1008];
  
  pcVar5 = s->s_name;
  if (*pcVar5 == '+') {
    pcVar5 = pcVar5 + 1;
  }
  else {
    bug("sys_decodedialog: %s",pcVar5);
  }
  for (lVar3 = 0; lVar3 != 999; lVar3 = lVar3 + 1) {
    cVar2 = *pcVar5;
    if (cVar2 == '+') {
      pcVar1 = pcVar5 + 1;
      cVar2 = pcVar5[1];
      if (cVar2 == '+') {
        local_3f8[lVar3] = '+';
        pcVar5 = pcVar1;
      }
      else if (cVar2 == 's') {
        local_3f8[lVar3] = ';';
        pcVar5 = pcVar1;
      }
      else if (cVar2 == 'c') {
        local_3f8[lVar3] = ',';
        pcVar5 = pcVar1;
      }
      else if (cVar2 == 'd') {
        local_3f8[lVar3] = '$';
        pcVar5 = pcVar1;
      }
      else if (cVar2 == '_') {
        local_3f8[lVar3] = ' ';
        pcVar5 = pcVar1;
      }
      else {
        local_3f8[lVar3] = '+';
      }
    }
    else {
      if (cVar2 == '\0') break;
      local_3f8[lVar3] = cVar2;
    }
    pcVar5 = pcVar5 + 1;
  }
  local_3f8[lVar3] = '\0';
  ptVar4 = gensym(local_3f8);
  return ptVar4;
}

Assistant:

t_symbol *sys_decodedialog(t_symbol *s)
{
    char buf[MAXPDSTRING];
    const char *sp = s->s_name;
    int i;
    if (*sp != '+')
        bug("sys_decodedialog: %s", sp);
    else sp++;
    for (i = 0; i < MAXPDSTRING-1; i++, sp++)
    {
        if (!sp[0])
            break;
        if (sp[0] == '+')
        {
            if (sp[1] == '_')
                buf[i] = ' ', sp++;
            else if (sp[1] == '+')
                buf[i] = '+', sp++;
            else if (sp[1] == 'c')
                buf[i] = ',', sp++;
            else if (sp[1] == 's')
                buf[i] = ';', sp++;
            else if (sp[1] == 'd')
                buf[i] = '$', sp++;
            else buf[i] = sp[0];
        }
        else buf[i] = sp[0];
    }
    buf[i] = 0;
    return (gensym(buf));
}